

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O1

void precomp_wnaf(pt_prj_t_conflict4 *precomp,pt_aff_t_conflict4 *P)

{
  uint64_t *out1;
  uint64_t *out1_00;
  uint64_t *out1_01;
  pt_prj_t_conflict4 *P_00;
  long lVar1;
  
  out1 = precomp->Y;
  out1_00 = precomp->T;
  out1_01 = precomp->Z;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1_00,P->X,const_T);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(out1,out1_00,const_S);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(precomp->X,out1_00,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1_01,P->Y,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1_00,out1_00,const_S);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1,P->Y,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1_00,precomp->X,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(precomp->X,precomp->X,out1_01);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1,out1,out1_01);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(out1_01,out1_01);
  point_double(precomp + 0xf,precomp);
  lVar1 = 0xf;
  P_00 = precomp;
  do {
    point_add_proj(P_00 + 1,precomp + 0xf,P_00);
    lVar1 = lVar1 + -1;
    P_00 = P_00 + 1;
  } while (lVar1 != 0);
  return;
}

Assistant:

static void precomp_wnaf(pt_prj_t precomp[DRADIX / 2], const pt_aff_t *P) {
    int i;

    /* move from legacy affine to Edwards projective */
    point_legacy2edwards(&precomp[0], P);
    point_double(&precomp[DRADIX / 2 - 1], &precomp[0]);

    for (i = 1; i < DRADIX / 2; i++)
        point_add_proj(&precomp[i], &precomp[DRADIX / 2 - 1], &precomp[i - 1]);
}